

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::LoadableStateIncrement
          (ChElementHexaANCF_3813_9 *this,uint off_x,ChState *x_new,ChState *x,uint off_v,
          ChStateDelta *Dv)

{
  long *plVar1;
  element_type *peVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  lVar3 = 0;
  uVar4 = off_v;
  uVar5 = off_x;
  do {
    plVar1 = *(long **)((long)&(((this->m_nodes).
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar3);
    (**(code **)(*plVar1 + 0xa8))(plVar1,uVar5,x_new,x,uVar4,Dv);
    uVar5 = uVar5 + 3;
    uVar4 = uVar4 + 3;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x80);
  peVar2 = (this->m_central_node).
           super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0xe])
            (peVar2,(ulong)(off_x + 0x18),x_new,x,(ulong)(off_v + 0x18),Dv);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::LoadableStateIncrement(const unsigned int off_x,
                                                      ChState& x_new,
                                                      const ChState& x,
                                                      const unsigned int off_v,
                                                      const ChStateDelta& Dv) {
    for (int i = 0; i < 8; i++) {
        this->m_nodes[i]->NodeIntStateIncrement(off_x + 3 * i, x_new, x, off_v + 3 * i, Dv);
    }
    this->m_central_node->NodeIntStateIncrement(off_x + 24, x_new, x, off_v + 24, Dv);
}